

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O0

ParserMetadata * slang::parsing::ParserMetadata::fromSyntax(SyntaxNode *root)

{
  MetadataVisitor *in_RDI;
  MetadataVisitor visitor;
  MetadataVisitor *this;
  ParserMetadata *in_stack_fffffffffffffe48;
  ParserMetadata *in_stack_fffffffffffffe50;
  
  this = in_RDI;
  anon_unknown_4::MetadataVisitor::MetadataVisitor(in_RDI);
  slang::syntax::SyntaxNode::visit<slang::parsing::(anonymous_namespace)::MetadataVisitor>
            ((SyntaxNode *)this,in_RDI);
  ParserMetadata(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
  anon_unknown_4::MetadataVisitor::~MetadataVisitor(this);
  return &this->meta;
}

Assistant:

ParserMetadata ParserMetadata::fromSyntax(const SyntaxNode& root) {
    MetadataVisitor visitor;
    root.visit(visitor);
    return visitor.meta;
}